

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

string * google::protobuf::TestSourceDir_abi_cxx11_(void)

{
  bool bVar1;
  char *__s;
  LogMessage *pLVar2;
  AlphaNum *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  AlphaNum local_128;
  AlphaNum local_f8;
  LogMessage local_c8;
  Voidify local_b1;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  allocator<char> local_2e;
  undefined1 local_2d;
  allocator<char> local_19;
  char *local_18;
  char *result;
  string *prefix;
  
  __s = getenv("srcdir");
  local_18 = __s;
  if (__s == (char *)0x0) {
    local_2d = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    while( true ) {
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_80,in_RDI);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,"/src/google/protobuf/descriptor.cc");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_50,(lts_20250127 *)&local_80,&local_b0,in_RCX);
      bVar1 = File::Exists(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bVar1 = File::Exists(in_RDI);
      if (!bVar1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
                   ,0x53);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar2,(char (*) [106])
                                   "Could not find protobuf source code.  Please run tests from somewhere within the protobuf source package."
                           );
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_b1,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_c8);
      }
      absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,"/..");
      absl::lts_20250127::StrAppend(in_RDI,&local_f8);
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_128,"/src");
    absl::lts_20250127::StrAppend(in_RDI,&local_128);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

std::string TestSourceDir() {
#ifndef GOOGLE_THIRD_PARTY_PROTOBUF
#ifdef GOOGLE_PROTOBUF_TEST_SOURCE_PATH
  return GOOGLE_PROTOBUF_TEST_SOURCE_PATH;
#else
#ifndef _MSC_VER
  // automake sets the "srcdir" environment variable.
  char* result = getenv("srcdir");
  if (result != nullptr) {
    return result;
  }
#endif  // _MSC_VER

  // Look for the "src" directory.
  std::string prefix = ".";

  // Keep looking further up the directory tree until we find
  // src/.../descriptor.cc. It is important to look for a particular file,
  // keeping in mind that with Bazel builds the directory structure under
  // bazel-bin/ looks similar to the main directory tree in the Git repo.
  while (!File::Exists(
      absl::StrCat(prefix, "/src/google/protobuf/descriptor.cc"))) {
    if (!File::Exists(prefix)) {
      ABSL_LOG(FATAL)
          << "Could not find protobuf source code.  Please run tests from "
             "somewhere within the protobuf source package.";
    }
    absl::StrAppend(&prefix, "/..");
  }
  absl::StrAppend(&prefix, "/src");
  return prefix;
#endif  // GOOGLE_PROTOBUF_TEST_SOURCE_PATH
#else
  return "third_party/protobuf/src";
#endif  // GOOGLE_THIRD_PARTY_PROTOBUF
}